

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

void __thiscall
LeavesAtDifferentLevels_UpsertIteration_Test::TestBody
          (LeavesAtDifferentLevels_UpsertIteration_Test *this)

{
  database *db;
  test_trie *ptVar1;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *phVar2;
  uint generation;
  value_reference_type ppVar3;
  iterator_base<false> *piVar4;
  char *pcVar5;
  AssertHelper local_7a0;
  string v7;
  string v6;
  AssertionResult gtest_ar_9;
  AssertHelper local_748;
  string v8;
  string v5;
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_638 [2];
  transaction_type t1;
  iterator begin;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  itp;
  iterator end;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_318;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_220;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_128;
  
  db = &(this->super_LeavesAtDifferentLevels).super_GenericIndexFixture.super_IndexFixture.db_;
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&itp,
             (mutex_type *)
             &(this->super_LeavesAtDifferentLevels).super_GenericIndexFixture.super_IndexFixture.
              field_0x10);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction(&t1,db,(lock_type *)&itp);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&itp);
  ptVar1 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&itp,"b",(allocator *)&v5);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            (&local_128,ptVar1,&t1,(string *)&itp);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_128.first.pos_);
  std::__cxx11::string::~string((string *)&itp);
  ptVar1 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&itp,"c",(allocator *)&v5);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            (&local_220,ptVar1,&t1,(string *)&itp);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_220.first.pos_);
  std::__cxx11::string::~string((string *)&itp);
  ptVar1 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&itp,"d",(allocator *)&v5);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            (&local_318,ptVar1,&t1,(string *)&itp);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&local_318.first.pos_);
  std::__cxx11::string::~string((string *)&itp);
  ptVar1 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&v5,"a",(allocator *)&begin);
  piVar4 = (iterator_base<false> *)&v5;
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign(&itp,ptVar1,&t1,(string *)piVar4)
  ;
  std::__cxx11::string::~string((string *)&v5);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::iterator_base(&begin,&itp.first);
  phVar2 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  memset(&end.visited_parents_,0,0xd8);
  end.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )0x0;
  end.db_ = db;
  end.index_ = phVar2;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>>
            ((char *)&v5,(char *)&begin,&end,piVar4);
  if ((char)v5._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v6);
    if (v5._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)v5._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x64d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v7,(Message *)&v6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v7);
    if ((long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v5._M_string_length);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v5,"\"a\"","v1",(char (*) [2])0x1edea1,&ppVar3->first);
  if ((char)v5._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v6);
    if (v5._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)v5._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x650,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v7,(Message *)&v6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v7);
    if ((long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v5._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v5,"\"b\"","v2",(char (*) [2])0x1e8fd5,&ppVar3->first);
  if ((char)v5._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v6);
    if (v5._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)v5._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x653,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v7,(Message *)&v6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v7);
    if ((long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v5._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v5,"\"c\"","v3",(char (*) [2])0x1ef03e,&ppVar3->first);
  if ((char)v5._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v6);
    if (v5._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)v5._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x656,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v7,(Message *)&v6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v7);
    if ((long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v5._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  piVar4 = (iterator_base<false> *)0x1e4284;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v5,"\"d\"","v4",(char (*) [2])0x1e4284,&ppVar3->first);
  if ((char)v5._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v6);
    if (v5._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)v5._M_string_length;
    }
    piVar4 = (iterator_base<false> *)0x659;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x659,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v7,(Message *)&v6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v7);
    if ((long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v5._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_nullptr>
            ((char *)&v5,(char *)&begin,&end,piVar4);
  if ((char)v5._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v6);
    if (v5._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)v5._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x65b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v7,(Message *)&v6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v7);
    if ((long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v6._M_dataplus._M_p._1_7_,(char)v6._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v5._M_string_length);
  phVar2 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  generation = pstore::database::get_current_revision(db);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flush(phVar2,&t1.super_transaction_base,generation);
  ptVar1 = (this->super_LeavesAtDifferentLevels).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  std::__cxx11::string::string((string *)&v6,"a",(allocator *)&v7);
  anon_unknown.dwarf_13be9a::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)&v5,ptVar1,&t1,&v6);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::operator=(&itp,(type)&v5);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(local_638);
  std::__cxx11::string::~string((string *)&v6);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator=(&begin,&itp.first);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  std::__cxx11::string::string((string *)&v5,(string *)ppVar3);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v6,"\"a\"","v5",(char (*) [2])0x1edea1,&v5);
  if ((char)v6._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v7);
    if (v6._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)v6._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x663,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v8,(Message *)&v7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v8);
    if ((long *)CONCAT71(v7._M_dataplus._M_p._1_7_,(char)v7._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v7._M_dataplus._M_p._1_7_,(char)v7._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v6._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  std::__cxx11::string::string((string *)&v6,(string *)ppVar3);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v7,"\"b\"","v6",(char (*) [2])0x1e8fd5,&v6);
  if ((char)v7._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&v8);
    if (v7._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)v7._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x666,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9,(Message *)&v8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9);
    if ((long *)CONCAT71(v8._M_dataplus._M_p._1_7_,(char)v8._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(v8._M_dataplus._M_p._1_7_,(char)v8._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v7._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  std::__cxx11::string::string((string *)&v7,(string *)ppVar3);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&v8,"\"c\"","v7",(char (*) [2])0x1ef03e,&v7);
  if ((char)v8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_9);
    if (v8._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)v8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x669,pcVar5);
    testing::internal::AssertHelper::operator=(&local_7a0,(Message *)&gtest_ar_9);
    testing::internal::AssertHelper::~AssertHelper(&local_7a0);
    if ((long *)CONCAT71(gtest_ar_9._1_7_,gtest_ar_9.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_9._1_7_,gtest_ar_9.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&v8._M_string_length);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  ppVar3 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*(&begin);
  std::__cxx11::string::string((string *)&v8,(string *)ppVar3);
  piVar4 = (iterator_base<false> *)0x1e4284;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar_9,"\"d\"","v8",(char (*) [2])0x1e4284,&v8);
  if (gtest_ar_9.success_ == false) {
    testing::Message::Message((Message *)&local_7a0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_9.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_9.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    piVar4 = (iterator_base<false> *)0x66c;
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x66c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_748,(Message *)&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    if (local_7a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_7a0.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_9.message_);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++(&begin);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_nullptr>
            (&gtest_ar_9.success_,(char *)&begin,&end,piVar4);
  if (gtest_ar_9.success_ == false) {
    testing::Message::Message((Message *)&local_7a0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_9.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_9.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x66e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_748,(Message *)&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    if (local_7a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_7a0.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_9.message_);
  std::__cxx11::string::~string((string *)&v8);
  std::__cxx11::string::~string((string *)&v7);
  std::__cxx11::string::~string((string *)&v6);
  std::__cxx11::string::~string((string *)&v5);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&end.pos_);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&begin.pos_);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&itp.first.pos_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  return;
}

Assistant:

TEST_F (LeavesAtDifferentLevels, UpsertIteration) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");
    this->insert_or_assign (*index_, t1, "d");
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "a");

    test_trie::iterator begin = itp.first;
    test_trie::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);

    std::string const & v1 = (*begin).first;
    EXPECT_EQ ("a", v1);
    ++begin;
    std::string const & v2 = (*begin).first;
    EXPECT_EQ ("b", v2);
    ++begin;
    std::string const & v3 = (*begin).first;
    EXPECT_EQ ("c", v3);
    ++begin;
    std::string const & v4 = (*begin).first;
    EXPECT_EQ ("d", v4);
    ++begin;
    EXPECT_EQ (begin, end);

    index_->flush (t1, db_.get_current_revision ());

    // Check trie iterator in the store.
    itp = this->insert_or_assign (*index_, t1, "a");
    begin = itp.first;
    std::string const v5 = begin->first;
    EXPECT_EQ ("a", v5);
    ++begin;
    std::string const v6 = begin->first;
    EXPECT_EQ ("b", v6);
    ++begin;
    std::string const v7 = begin->first;
    EXPECT_EQ ("c", v7);
    ++begin;
    std::string const v8 = begin->first;
    EXPECT_EQ ("d", v8);
    ++begin;
    EXPECT_EQ (begin, end);
}